

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int ReconstructUV(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int16_t tmp [8] [16];
  int n;
  int nz;
  VP8SegmentInfo *dqm;
  uint8_t *src;
  uint8_t *ref;
  VP8Encoder *enc;
  int16_t aiStackY_148 [24];
  VP8ModeScore *in_stack_fffffffffffffee8;
  int16_t (*in_stack_fffffffffffffef0) [16];
  VP8Matrix *in_stack_fffffffffffffef8;
  VP8EncIterator *in_stack_ffffffffffffff00;
  int local_48;
  uint local_44;
  
  lVar2 = *(long *)(in_RDI + 0x28);
  lVar5 = *(long *)(in_RDI + 0x20) + (long)(int)(uint)VP8UVModeOffsets[in_ECX];
  lVar3 = *(long *)(in_RDI + 8);
  bVar1 = **(byte **)(in_RDI + 0x30);
  local_44 = 0;
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 2) {
    (*VP8FTransform2)((uint8_t *)(lVar3 + 0x10 + (long)(int)(uint)VP8ScanUV[local_48]),
                      (uint8_t *)(lVar5 + (int)(uint)VP8ScanUV[local_48]),
                      aiStackY_148 + (long)local_48 * 0x10);
  }
  if (*(long *)(in_RDI + 0x160) != 0) {
    CorrectDCValues(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                    in_stack_fffffffffffffee8);
  }
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 2) {
    iVar4 = (*VP8EncQuantize2Blocks)
                      (aiStackY_148 + (long)local_48 * 0x10,
                       (int16_t *)(in_RSI + 0x248 + (long)local_48 * 0x20),
                       (VP8Matrix *)(lVar2 + (ulong)(bVar1 >> 5 & 3) * 0x2e8 + 0x420));
    local_44 = iVar4 << ((byte)local_48 & 0x1f) | local_44;
  }
  for (local_48 = 0; local_48 < 8; local_48 = local_48 + 2) {
    (*VP8ITransform)((uint8_t *)(lVar5 + (int)(uint)VP8ScanUV[local_48]),
                     aiStackY_148 + (long)local_48 * 0x10,
                     (uint8_t *)(in_RDX + (int)(uint)VP8ScanUV[local_48]),1);
  }
  return local_44 << 0x10;
}

Assistant:

static int ReconstructUV(VP8EncIterator* WEBP_RESTRICT const it,
                         VP8ModeScore* WEBP_RESTRICT const rd,
                         uint8_t* WEBP_RESTRICT const yuv_out, int mode) {
  const VP8Encoder* const enc = it->enc;
  const uint8_t* const ref = it->yuv_p + VP8UVModeOffsets[mode];
  const uint8_t* const src = it->yuv_in + U_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm[it->mb->segment];
  int nz = 0;
  int n;
  int16_t tmp[8][16];

  for (n = 0; n < 8; n += 2) {
    VP8FTransform2(src + VP8ScanUV[n], ref + VP8ScanUV[n], tmp[n]);
  }
  if (it->top_derr != NULL) CorrectDCValues(it, &dqm->uv, tmp, rd);

  if (DO_TRELLIS_UV && it->do_trellis) {
    int ch, x, y;
    for (ch = 0, n = 0; ch <= 2; ch += 2) {
      for (y = 0; y < 2; ++y) {
        for (x = 0; x < 2; ++x, ++n) {
          const int ctx = it->top_nz[4 + ch + x] + it->left_nz[4 + ch + y];
          const int non_zero = TrellisQuantizeBlock(
              enc, tmp[n], rd->uv_levels[n], ctx, TYPE_CHROMA_A, &dqm->uv,
              dqm->lambda_trellis_uv);
          it->top_nz[4 + ch + x] = it->left_nz[4 + ch + y] = non_zero;
          nz |= non_zero << n;
        }
      }
    }
  } else {
    for (n = 0; n < 8; n += 2) {
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->uv_levels[n], &dqm->uv) << n;
    }
  }

  for (n = 0; n < 8; n += 2) {
    VP8ITransform(ref + VP8ScanUV[n], tmp[n], yuv_out + VP8ScanUV[n], 1);
  }
  return (nz << 16);
}